

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-itr.c
# Opt level: O2

rtosc_arg_val_t * rtosc_arg_val_itr_get(rtosc_arg_val_itr *itr,rtosc_arg_val_t *buffer)

{
  rtosc_arg_val_t *range_arg;
  double dVar1;
  undefined7 uVar2;
  int32_t iVar3;
  rtosc_arg_val_t *prVar4;
  
  prVar4 = itr->av;
  if (prVar4->type == '-') {
    iVar3 = rtosc_av_rep_has_delta(prVar4);
    range_arg = itr->av;
    prVar4 = buffer;
    if (iVar3 == 0) {
      (buffer->val).b.data = range_arg[1].val.b.data;
      uVar2 = *(undefined7 *)&range_arg[1].field_0x1;
      dVar1 = range_arg[1].val.d;
      buffer->type = range_arg[1].type;
      *(undefined7 *)&buffer->field_0x1 = uVar2;
      (buffer->val).d = dVar1;
    }
    else {
      rtosc_arg_val_range_arg(range_arg,itr->range_i,buffer);
    }
  }
  return prVar4;
}

Assistant:

const rtosc_arg_val_t* rtosc_arg_val_itr_get(const rtosc_arg_val_itr *itr,
                                             rtosc_arg_val_t* buffer)
{
    const rtosc_arg_val_t* result;
    if(itr->av->type == '-')
    {
        if(rtosc_av_rep_has_delta(itr->av))
            rtosc_arg_val_range_arg(itr->av, itr->range_i, buffer);
        else
            *buffer = itr->av[1];
        result = buffer;
    }
    else result = itr->av;
    return result;
}